

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QRect __thiscall
QTreeViewPrivate::intersectedRect
          (QTreeViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  QModelIndex *in_RCX;
  long in_RDI;
  QModelIndex *in_R8;
  long in_FS_OFFSET;
  QRect QVar6;
  int col;
  int row;
  QRect idxRect;
  QModelIndex idx;
  QRect rowRect;
  QModelIndex idxCol0;
  int right;
  int left;
  QRect updateRect;
  QModelIndex parentIdx;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  QRect *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  QTreeViewPrivate *in_stack_fffffffffffffea8;
  bool local_14d;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  uint in_stack_fffffffffffffed8;
  int iVar7;
  undefined1 *local_f8;
  undefined1 *local_f0;
  int local_e8;
  int local_e4;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [16];
  QPersistentModelIndex local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  int local_48;
  int local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  QAbstractItemViewPrivate::executePostedLayout
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_44 = std::numeric_limits<int>::max();
  local_48 = std::numeric_limits<int>::min();
  iVar2 = QModelIndex::row(in_RCX);
  while (iVar7 = iVar2, iVar3 = QModelIndex::row(in_R8), iVar2 <= iVar3) {
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(**(long **)(in_RDI + 0x2f8) + 0x60))
              (&local_60,*(long **)(in_RDI + 0x2f8),iVar7,0,&local_30);
    bVar1 = isRowHidden(in_stack_fffffffffffffea8,
                        (QModelIndex *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                       );
    if (!bVar1) {
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      iVar2 = local_44;
      iVar3 = std::numeric_limits<int>::max();
      if (iVar2 == iVar3) {
        bVar1 = QSet<QPersistentModelIndex>::isEmpty((QSet<QPersistentModelIndex> *)0x8f5c02);
        in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 & 0xffffff;
        local_14d = false;
        if (!bVar1) {
          in_stack_fffffffffffffea8 = (QTreeViewPrivate *)(in_RDI + 0x5f0);
          QPersistentModelIndex::QPersistentModelIndex(&local_98,(QModelIndex *)&local_60);
          in_stack_fffffffffffffed8 = CONCAT13(1,(int3)in_stack_fffffffffffffed8);
          local_14d = QSet<QPersistentModelIndex>::contains
                                ((QSet<QPersistentModelIndex> *)
                                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                 (QPersistentModelIndex *)
                                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        }
        in_stack_fffffffffffffea4 = CONCAT13(local_14d,(int3)in_stack_fffffffffffffea4);
        if ((in_stack_fffffffffffffed8 & 0x1000000) != 0) {
          QPersistentModelIndex::~QPersistentModelIndex(&local_98);
        }
        if ((in_stack_fffffffffffffea4 & 0x1000000) == 0) {
          in_stack_fffffffffffffea0 = QModelIndex::column(in_RCX);
          while (in_stack_fffffffffffffed4 = in_stack_fffffffffffffea0,
                iVar2 = QModelIndex::column(in_R8), in_stack_fffffffffffffea0 <= iVar2) {
            bVar1 = QHeaderView::isSectionHidden
                              ((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                               in_stack_fffffffffffffe94);
            if (!bVar1) {
              local_c0 = &DAT_aaaaaaaaaaaaaaaa;
              local_b8 = &DAT_aaaaaaaaaaaaaaaa;
              local_b0 = &DAT_aaaaaaaaaaaaaaaa;
              (**(code **)(**(long **)(in_RDI + 0x2f8) + 0x60))
                        (&local_c0,*(long **)(in_RDI + 0x2f8),iVar7,in_stack_fffffffffffffed4,
                         &local_30);
              local_d0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d0 = (undefined1  [16])
                         visualRect((QTreeViewPrivate *)CONCAT44(iVar7,in_stack_fffffffffffffed8),
                                    (QModelIndex *)
                                    CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                    (RectRule)((ulong)in_RDI >> 0x20));
              bVar1 = QRect::isNull((QRect *)CONCAT44(in_stack_fffffffffffffe84,
                                                      in_stack_fffffffffffffe80));
              if (!bVar1) {
                in_stack_fffffffffffffe9c = QRect::top((QRect *)0x8f5df2);
                iVar2 = QRect::bottom((QRect *)0x8f5e03);
                if (iVar2 < in_stack_fffffffffffffe9c) break;
                in_stack_fffffffffffffe98 = QRect::bottom((QRect *)0x8f5e1a);
                iVar2 = QRect::top((QRect *)0x8f5e2b);
                if (in_stack_fffffffffffffe98 < iVar2) break;
                uVar4 = QRect::intersects((QRect *)local_d0);
                if ((uVar4 & 1) != 0) {
                  local_e0 = (undefined1  [16])
                             QRect::united((QRect *)CONCAT44(in_stack_fffffffffffffe84,
                                                             in_stack_fffffffffffffe80),
                                           (QRect *)CONCAT44(in_stack_fffffffffffffe7c,
                                                             in_stack_fffffffffffffe78));
                  local_70 = (undefined1 *)local_e0._0_8_;
                  local_68 = (undefined1 *)local_e0._8_8_;
                  in_stack_fffffffffffffe94 = QRect::left((QRect *)0x8f5eaa);
                  iVar2 = QRect::left((QRect *)0x8f5ebb);
                  if (in_stack_fffffffffffffe94 < iVar2) {
                    iVar2 = QRect::right((QRect *)0x8f5ed2);
                    iVar3 = QRect::right((QRect *)0x8f5ee3);
                    if (iVar3 < iVar2) break;
                  }
                }
              }
            }
            in_stack_fffffffffffffea0 = in_stack_fffffffffffffed4 + 1;
          }
          bVar1 = QRect::isValid((QRect *)CONCAT44(in_stack_fffffffffffffe84,
                                                   in_stack_fffffffffffffe80));
          if (bVar1) {
            local_e4 = QRect::left((QRect *)0x8f5f21);
            piVar5 = std::min<int>(&local_44,&local_e4);
            local_44 = *piVar5;
            local_e8 = QRect::right((QRect *)0x8f5f53);
            piVar5 = std::max<int>(&local_48,&local_e8);
            local_48 = *piVar5;
          }
        }
        else {
          local_a8 = (undefined1  [16])
                     visualRect((QTreeViewPrivate *)CONCAT44(iVar7,in_stack_fffffffffffffed8),
                                (QModelIndex *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (RectRule)((ulong)in_RDI >> 0x20));
          local_70 = (undefined1 *)local_a8._0_8_;
          local_68 = (undefined1 *)local_a8._8_8_;
          uVar4 = QRect::intersects((QRect *)&local_70);
          if ((uVar4 & 1) == 0) goto LAB_008f5fe2;
        }
      }
      else {
        local_80 = (undefined1  [16])
                   visualRect((QTreeViewPrivate *)CONCAT44(iVar7,in_stack_fffffffffffffed8),
                              (QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (RectRule)((ulong)in_RDI >> 0x20));
        local_70 = (undefined1 *)local_80._0_8_;
        local_68 = (undefined1 *)local_80._8_8_;
        uVar4 = QRect::intersects((QRect *)&local_70);
        if ((uVar4 & 1) == 0) goto LAB_008f5fe2;
        QRect::top((QRect *)0x8f5b94);
        QRect::bottom((QRect *)0x8f5bb0);
        QRect::QRect(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                     in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
        local_70 = local_90;
        local_68 = local_88;
      }
      QVar6 = QRect::united((QRect *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (QRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_f8 = QVar6._0_8_;
      local_40 = local_f8;
      local_f0 = QVar6._8_8_;
      local_38 = local_f0;
      uVar4 = QRect::contains((QRect *)&local_40,SUB81(local_18,0));
      if ((uVar4 & 1) != 0) break;
    }
LAB_008f5fe2:
    iVar2 = iVar7 + 1;
  }
  QVar6 = QRect::intersected((QRect *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             (QRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return QVar6;
}

Assistant:

QRect QTreeViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    const auto parentIdx = topLeft.parent();
    executePostedLayout();
    QRect updateRect;
    int left = std::numeric_limits<int>::max();
    int right = std::numeric_limits<int>::min();
    for (int row = topLeft.row(); row <= bottomRight.row(); ++row) {
        const auto idxCol0 = model->index(row, 0, parentIdx);
        if (isRowHidden(idxCol0))
            continue;
        QRect rowRect;
        if (left != std::numeric_limits<int>::max()) {
            // we already know left and right boundary of the rect to update
            rowRect = visualRect(idxCol0, FullRow);
            if (!rowRect.intersects(rect))
                continue;
            rowRect = QRect(left, rowRect.top(), right, rowRect.bottom());
        } else if (!spanningIndexes.isEmpty() && spanningIndexes.contains(idxCol0)) {
            // isFirstColumnSpanned re-creates the child index so take a shortcut here
            // spans the whole row, therefore ask for FullRow instead for every cell
            rowRect = visualRect(idxCol0, FullRow);
            if (!rowRect.intersects(rect))
                continue;
        } else {
            for (int col = topLeft.column(); col <= bottomRight.column(); ++col) {
                if (header->isSectionHidden(col))
                    continue;
                const QModelIndex idx(model->index(row, col, parentIdx));
                const QRect idxRect = visualRect(idx, SingleSection);
                if (idxRect.isNull())
                    continue;
                // early exit when complete row is out of viewport
                if (idxRect.top() > rect.bottom() || idxRect.bottom() < rect.top())
                    break;
                if (!idxRect.intersects(rect))
                    continue;
                rowRect = rowRect.united(idxRect);
                if (rowRect.left() < rect.left() && rowRect.right() > rect.right())
                    break;
            }
            if (rowRect.isValid()) {
                left = std::min(left, rowRect.left());
                right = std::max(right, rowRect.right());
            }
        }
        updateRect = updateRect.united(rowRect);
        if (updateRect.contains(rect))  // already full rect covered?
            break;
    }
    return rect.intersected(updateRect);
}